

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1993bc8::IFFT2DTest_Correctness_Test::TestBody(IFFT2DTest_Correctness_Test *this)

{
  float *pfVar1;
  ParamType *pPVar2;
  int iVar3;
  int iVar4;
  int i;
  ulong uVar5;
  SEARCH_METHODS *pSVar6;
  int iVar7;
  int iVar8;
  int n;
  int local_a4;
  vector<float,_std::allocator<float>_> expected;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff78;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> input_c;
  vector<float,_std::allocator<float>_> actual;
  AssertionResult gtest_ar_1;
  AssertHelper local_38;
  
  pPVar2 = testing::WithParamInterface<(anonymous_namespace)::IFFTTestArg>::GetParam();
  n = pPVar2->n;
  actual.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 2;
  testing::internal::CmpHelperGE<int,int>((internal *)&expected,"n","2",&n,(int *)&actual);
  if ((char)expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&actual);
    if (expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pSVar6 = "";
    }
    else {
      pSVar6 = *(SEARCH_METHODS **)
                expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&input_c,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/fft_test.cc"
               ,0xcd,(char *)pSVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&input_c,(Message *)&actual);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&input_c);
    if ((long *)CONCAT44(actual.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         actual.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(actual.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     actual.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish);
    std::vector<float,_std::allocator<float>_>::vector
              (&expected,(ulong)(uint)(n * n),(allocator_type *)&actual);
    std::vector<float,_std::allocator<float>_>::vector
              (&actual,(ulong)(uint)(n * n),(allocator_type *)&input_c);
    iVar3 = n;
    for (iVar8 = 0; iVar8 < iVar3; iVar8 = iVar8 + 1) {
      for (iVar4 = 0; iVar4 < iVar3; iVar4 = iVar4 + 1) {
        ((float *)
        CONCAT71(expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start._1_7_,
                 (char)expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start))[iVar3 * iVar8 + iVar4] = 1.0;
        local_a4 = iVar4;
        fft2d<float>(&input_c,(float *)CONCAT71(expected.
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                (char)expected.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),iVar3);
        pfVar1 = (this->super_IFFT2DTest).input_;
        for (uVar5 = 0; (uint)(n * n) != uVar5; uVar5 = uVar5 + 1) {
          pfVar1[uVar5 * 2] =
               *(float *)&input_c.
                          super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_value;
          pfVar1[uVar5 * 2 + 1] =
               *(float *)((long)&input_c.
                                 super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_value + 4);
        }
        pPVar2 = testing::WithParamInterface<(anonymous_namespace)::IFFTTestArg>::GetParam();
        (*pPVar2->ifft)((this->super_IFFT2DTest).input_,(this->super_IFFT2DTest).temp_,
                        (this->super_IFFT2DTest).output_);
        iVar3 = n;
        for (iVar7 = 0; iVar4 = local_a4, iVar7 < iVar3; iVar7 = iVar7 + 1) {
          for (iVar4 = 0; iVar4 < iVar3; iVar4 = iVar4 + 1) {
            testing::internal::DoubleNearPredFormat
                      ((char *)CONCAT71(expected.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_start._1_7_,
                                        (char)expected.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start),
                       (char *)CONCAT44(local_a4,n),
                       (char *)expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish,
                       (double)input_c.
                               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,
                       (double)input_c.
                               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                       (double)in_stack_ffffffffffffff78._M_head_impl);
            if (gtest_ar_1.success_ == false) {
              testing::Message::Message((Message *)&stack0xffffffffffffff78);
              pSVar6 = "";
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl !=
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pSVar6 = *(SEARCH_METHODS **)
                          gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_38,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/fft_test.cc"
                         ,0xde,(char *)pSVar6);
              testing::internal::AssertHelper::operator=
                        (&local_38,(Message *)&stack0xffffffffffffff78);
              testing::internal::AssertHelper::~AssertHelper(&local_38);
              if (in_stack_ffffffffffffff78._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)in_stack_ffffffffffffff78._M_head_impl + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_1.message_);
            iVar3 = n;
          }
        }
        *(undefined4 *)
         (CONCAT71(expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start._1_7_,
                   (char)expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start) + (long)(iVar3 * iVar8 + local_a4) * 4) =
             0;
        std::_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>::~_Vector_base
                  (&input_c.
                    super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>);
        iVar3 = n;
      }
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&actual.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&expected.super__Vector_base<float,_std::allocator<float>_>);
  }
  return;
}

Assistant:

TEST_P(IFFT2DTest, Correctness) {
  int n = GetParam().n;
  ASSERT_GE(n, 2);
  std::vector<float> expected(n * n);
  std::vector<float> actual(n * n);
  // Do forward transform then invert to make sure we get back expected
  for (int y = 0; y < n; ++y) {
    for (int x = 0; x < n; ++x) {
      expected[y * n + x] = 1;
      std::vector<std::complex<float> > input_c = fft2d(&expected[0], n);
      for (int i = 0; i < n * n; ++i) {
        input_[2 * i + 0] = input_c[i].real();
        input_[2 * i + 1] = input_c[i].imag();
      }
      GetParam().ifft(&input_[0], &temp_[0], &output_[0]);

      for (int yy = 0; yy < n; ++yy) {
        for (int xx = 0; xx < n; ++xx) {
          EXPECT_NEAR(expected[yy * n + xx], output_[yy * n + xx] / (n * n),
                      1e-5);
        }
      }
      expected[y * n + x] = 0;
    }
  }
}